

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBase *
CreateFunctionPointer
          (ExpressionContext *ctx,SynBase *source,ExprFunctionDefinition *definition,
          bool hideFunction)

{
  FunctionData *function;
  TypeFunction *type;
  int iVar1;
  undefined4 extraout_var;
  SynBase *source_00;
  SynBase *source_01;
  ExprBase *context;
  undefined4 extraout_var_00;
  undefined7 in_register_00000009;
  ulong uVar2;
  ArrayView<ExprBase_*> arr;
  SmallArray<ExprBase_*,_3U> local_60;
  
  if ((int)CONCAT71(in_register_00000009,hideFunction) != 0) {
    ExpressionContext::HideFunction(ctx,definition->function);
    definition->function->isHidden = true;
  }
  local_60.allocator = ctx->allocator;
  local_60.data = local_60.little;
  local_60.count = 1;
  local_60.little[0] = &definition->super_ExprBase;
  if (definition->contextVariableDefinition != (ExprVariableDefinition *)0x0) {
    local_60.max = 3;
    local_60.count = 1;
    if (local_60.data == (ExprBase **)0x0) goto LAB_0014ec5b;
    local_60.count = 2;
    local_60.little[1] = &definition->contextVariableDefinition->super_ExprBase;
  }
  local_60.max = 3;
  iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
  source_00 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
  function = definition->function;
  type = function->type;
  source_01 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
  context = CreateFunctionContextAccess(ctx,source_01,definition->function);
  ExprFunctionAccess::ExprFunctionAccess
            ((ExprFunctionAccess *)CONCAT44(extraout_var,iVar1),source_00,&type->super_TypeBase,
             function,context);
  if (local_60.count == local_60.max) {
    SmallArray<ExprBase_*,_3U>::grow(&local_60,local_60.count);
  }
  if (local_60.data != (ExprBase **)0x0) {
    uVar2 = (ulong)local_60.count;
    local_60.count = local_60.count + 1;
    local_60.data[uVar2] = (ExprBase *)CONCAT44(extraout_var,iVar1);
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
    arr.count = local_60.count;
    arr.data = local_60.data;
    arr._12_4_ = 0;
    ExprSequence::ExprSequence
              ((ExprSequence *)CONCAT44(extraout_var_00,iVar1),ctx->allocator,source,
               &definition->function->type->super_TypeBase,arr);
    SmallArray<ExprBase_*,_3U>::~SmallArray(&local_60);
    return &((ExprSequence *)CONCAT44(extraout_var_00,iVar1))->super_ExprBase;
  }
LAB_0014ec5b:
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x162,"void SmallArray<ExprBase *, 3>::push_back(const T &) [T = ExprBase *, N = 3]"
               );
}

Assistant:

ExprBase* CreateFunctionPointer(ExpressionContext &ctx, SynBase *source, ExprFunctionDefinition *definition, bool hideFunction)
{
	if(hideFunction)
	{
		ctx.HideFunction(definition->function);

		definition->function->isHidden = true;
	}

	SmallArray<ExprBase*, 3> expressions(ctx.allocator);

	expressions.push_back(definition);

	if(definition->contextVariableDefinition)
		expressions.push_back(definition->contextVariableDefinition);

	expressions.push_back(new (ctx.get<ExprFunctionAccess>()) ExprFunctionAccess(ctx.MakeInternal(source), definition->function->type, definition->function, CreateFunctionContextAccess(ctx, ctx.MakeInternal(source), definition->function)));

	return new (ctx.get<ExprSequence>()) ExprSequence(ctx.allocator, source, definition->function->type, expressions);
}